

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O2

int ARKStepSetNonlinearSolver(void *arkode_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  int iVar2;
  char *module;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  
  iVar2 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetNonlinearSolver",&ark_mem,&step_mem);
  if (iVar2 == 0) {
    if (NLS == (SUNNonlinearSolver)0x0) {
      module = "ARKode::ARKStep";
      msgfmt = "The NLS input must be non-NULL";
      ark_mem = (ARKodeMem)0x0;
    }
    else {
      p_Var1 = NLS->ops;
      if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
          (p_Var1->solve ==
           (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_realtype_int_void_ptr *)0x0)) ||
         (p_Var1->setsysfn == (_func_int_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
        module = "ARKode";
        msgfmt = "NLS does not support required operations";
      }
      else {
        if ((step_mem->NLS != (SUNNonlinearSolver)0x0) && (step_mem->ownNLS != 0)) {
          SUNNonlinSolFree(step_mem->NLS);
        }
        step_mem->NLS = NLS;
        step_mem->ownNLS = 0;
        iVar2 = SUNNonlinSolSetConvTestFn(NLS,arkStep_NlsConvTest,ark_mem);
        if (iVar2 == 0) {
          iVar2 = SUNNonlinSolSetMaxIters(step_mem->NLS,step_mem->maxcor);
          if (iVar2 == 0) {
            if (step_mem->fi != (ARKRhsFn)0x0) {
              step_mem->nls_fi = step_mem->fi;
              return 0;
            }
            module = "ARKode::ARKStep";
            msgfmt = "The implicit ODE RHS function is NULL";
          }
          else {
            module = "ARKode::ARKStep";
            msgfmt = "Setting maximum number of nonlinear iterations failed";
          }
        }
        else {
          module = "ARKode::ARKStep";
          msgfmt = "Setting convergence test function failed";
        }
      }
    }
    iVar2 = -0x16;
    arkProcessError(ark_mem,-0x16,module,"ARKStepSetNonlinearSolver",msgfmt);
  }
  return iVar2;
}

Assistant:

int ARKStepSetNonlinearSolver(void *arkode_mem, SUNNonlinearSolver NLS)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetNonlinearSolver",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* Return immediately if NLS input is NULL */
  if (NLS == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "The NLS input must be non-NULL");
    return(ARK_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if ( (NLS->ops->gettype    == NULL) ||
       (NLS->ops->solve      == NULL) ||
       (NLS->ops->setsysfn   == NULL) ) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "ARKStepSetNonlinearSolver",
                    "NLS does not support required operations");
    return(ARK_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
    retval = SUNNonlinSolFree(step_mem->NLS);

  /* set SUNNonlinearSolver pointer */
  step_mem->NLS = NLS;
  step_mem->ownNLS = SUNFALSE;

  /* set default convergence test function */
  retval = SUNNonlinSolSetConvTestFn(step_mem->NLS, arkStep_NlsConvTest,
                                     (void*) ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "Setting convergence test function failed");
    return(ARK_ILL_INPUT);
  }

  /* set default nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "Setting maximum number of nonlinear iterations failed");
    return(ARK_ILL_INPUT);
  }

  /* set the nonlinear system RHS function */
  if (!(step_mem->fi)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                    "ARKStepSetNonlinearSolver",
                    "The implicit ODE RHS function is NULL");
    return(ARK_ILL_INPUT);
  }
  step_mem->nls_fi = step_mem->fi;

  return(ARK_SUCCESS);
}